

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_get_current_device(cubeb_stream_conflict *stm,cubeb_device **device)

{
  void *pvVar1;
  char *pcVar2;
  long *in_RSI;
  long in_RDI;
  char *name_1;
  char *name;
  char *local_38;
  char *local_30;
  int local_4;
  
  pvVar1 = calloc(1,0x10);
  *in_RSI = (long)pvVar1;
  if (*in_RSI == 0) {
    local_4 = -1;
  }
  else {
    if (*(long *)(in_RDI + 0x18) != 0) {
      pcVar2 = (*cubeb_pa_stream_get_device_name)(*(pa_stream **)(in_RDI + 0x18));
      if (pcVar2 == (char *)0x0) {
        local_30 = (char *)0x0;
      }
      else {
        local_30 = strdup(pcVar2);
      }
      *(char **)(*in_RSI + 8) = local_30;
    }
    if (*(long *)(in_RDI + 0x10) != 0) {
      pcVar2 = (*cubeb_pa_stream_get_device_name)(*(pa_stream **)(in_RDI + 0x10));
      if (pcVar2 == (char *)0x0) {
        local_38 = (char *)0x0;
      }
      else {
        local_38 = strdup(pcVar2);
      }
      *(char **)*in_RSI = local_38;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
pulse_stream_get_current_device(cubeb_stream * stm, cubeb_device ** const device)
{
#if PA_CHECK_VERSION(0, 9, 8)
  *device = calloc(1, sizeof(cubeb_device));
  if (*device == NULL)
    return CUBEB_ERROR;

  if (stm->input_stream) {
    const char * name = WRAP(pa_stream_get_device_name)(stm->input_stream);
    (*device)->input_name = (name == NULL) ? NULL : strdup(name);
  }

  if (stm->output_stream) {
    const char * name = WRAP(pa_stream_get_device_name)(stm->output_stream);
    (*device)->output_name = (name == NULL) ? NULL : strdup(name);
  }

  return CUBEB_OK;
#else
  return CUBEB_ERROR_NOT_SUPPORTED;
#endif
}